

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O3

unsigned_long_long __thiscall FatSystem::clusterAddress(FatSystem *this,uint cluster,bool isRoot)

{
  long lVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  uVar3 = (ulong)cluster;
  lVar1 = 0;
  if ((int)CONCAT71(in_register_00000011,isRoot) == 0) {
    uVar3 = (ulong)(cluster - 2);
    lVar1 = this->rootEntries << 5;
  }
  uVar2 = (ulong)(cluster - 2);
  if (this->type != 0) {
    uVar2 = uVar3;
  }
  if (this->type != 1) {
    lVar1 = 0;
  }
  return lVar1 + this->sectorsPerCluster * this->bytesPerSector * uVar2 + this->dataStart;
}

Assistant:

unsigned long long FatSystem::clusterAddress(unsigned int cluster, bool isRoot)
{
    if (type == FAT32 || !isRoot) {
        cluster -= 2;
    }

    unsigned long long addr = (dataStart + bytesPerSector*sectorsPerCluster*cluster);

    if (type == FAT16 && !isRoot) {
        addr += rootEntries * FAT_ENTRY_SIZE;
    }

    return addr;
}